

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.c
# Opt level: O3

xmlErrorPtr xmlCtxtGetLastError(void *ctx)

{
  xmlErrorPtr pxVar1;
  
  if (ctx != (void *)0x0) {
    pxVar1 = (xmlErrorPtr)0x0;
    if (*(int *)((long)ctx + 0x25c) != 0) {
      pxVar1 = (xmlErrorPtr)((long)ctx + 600);
    }
    return pxVar1;
  }
  return (xmlErrorPtr)0x0;
}

Assistant:

xmlErrorPtr
xmlCtxtGetLastError(void *ctx)
{
    xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) ctx;

    if (ctxt == NULL)
        return (NULL);
    if (ctxt->lastError.code == XML_ERR_OK)
        return (NULL);
    return (&ctxt->lastError);
}